

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *elem,xmlChar *name,xmlChar *ns,
                   xmlAttributeType type,xmlAttributeDefault def,xmlChar *defaultValue,
                   xmlEnumerationPtr tree)

{
  int iVar1;
  void *pvVar2;
  xmlChar *pxVar3;
  xmlElementPtr elem_00;
  bool bVar4;
  xmlAttributePtr local_70;
  xmlAttributePtr tmp;
  _xmlDict *p_Stack_60;
  int res;
  xmlDictPtr dict;
  xmlElementPtr elemDef;
  xmlAttributeTablePtr table;
  xmlAttributePtr ret;
  xmlAttributeType type_local;
  xmlChar *ns_local;
  xmlChar *name_local;
  xmlChar *elem_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  p_Stack_60 = (xmlDictPtr)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  if (name == (xmlChar *)0x0) {
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  if (elem == (xmlChar *)0x0) {
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  if (dtd->doc != (_xmlDoc *)0x0) {
    p_Stack_60 = dtd->doc->dict;
  }
  if (8 < type - XML_ATTRIBUTE_CDATA && type != XML_ATTRIBUTE_NOTATION) {
    xmlErrValid(ctxt,XML_ERR_ARGUMENT,"xmlAddAttributeDecl: invalid type\n",(char *)0x0);
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  switch((long)&switchD_001794f5::switchdataD_0023f888 +
         (long)(int)(&switchD_001794f5::switchdataD_0023f888)[type - XML_ATTRIBUTE_CDATA]) {
  case 0x1794f7:
    break;
  case 0x1794f9:
    break;
  case 0x1794fb:
    break;
  case 0x1794fd:
    break;
  case 0x1794ff:
    break;
  case 0x179501:
    break;
  case 0x179503:
    break;
  case 0x179505:
    break;
  case 0x179507:
    break;
  case 0x179509:
  }
  if ((defaultValue != (xmlChar *)0x0) &&
     (iVar1 = xmlValidateAttributeValueInternal(dtd->doc,type,defaultValue), iVar1 == 0)) {
    xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_DEFAULT,
                    "Attribute %s of %s: invalid default value\n",elem,name,defaultValue);
    defaultValue = (xmlChar *)0x0;
    if (ctxt != (xmlValidCtxtPtr)0x0) {
      ctxt->valid = 0;
    }
  }
  if ((((dtd->doc != (_xmlDoc *)0x0) && (dtd->doc->extSubset == dtd)) &&
      (dtd->doc->intSubset != (_xmlDtd *)0x0)) &&
     ((dtd->doc->intSubset->attributes != (void *)0x0 &&
      (pvVar2 = xmlHashLookup3((xmlHashTablePtr)dtd->doc->intSubset->attributes,name,ns,elem),
      pvVar2 != (void *)0x0)))) {
    xmlFreeEnumeration(tree);
    return (xmlAttributePtr)0x0;
  }
  table = (xmlAttributeTablePtr)0x0;
  elemDef = (xmlElementPtr)dtd->attributes;
  if (elemDef == (xmlElementPtr)0x0) {
    elemDef = (xmlElementPtr)xmlHashCreateDict(0,p_Stack_60);
    dtd->attributes = elemDef;
  }
  if ((elemDef != (xmlElementPtr)0x0) &&
     (table = (xmlAttributeTablePtr)(*xmlMalloc)(0x78),
     (xmlAttributePtr)table != (xmlAttributePtr)0x0)) {
    memset(table,0,0x78);
    ((xmlAttributePtr)table)->type = XML_ATTRIBUTE_DECL;
    ((xmlAttributePtr)table)->atype = type;
    ((xmlAttributePtr)table)->doc = dtd->doc;
    if (p_Stack_60 == (xmlDictPtr)0x0) {
      pxVar3 = xmlStrdup(name);
      ((xmlAttributePtr)table)->name = pxVar3;
      pxVar3 = xmlStrdup(elem);
      ((xmlAttributePtr)table)->elem = pxVar3;
    }
    else {
      pxVar3 = xmlDictLookup(p_Stack_60,name,-1);
      ((xmlAttributePtr)table)->name = pxVar3;
      pxVar3 = xmlDictLookup(p_Stack_60,elem,-1);
      ((xmlAttributePtr)table)->elem = pxVar3;
    }
    if ((((xmlAttributePtr)table)->name != (xmlChar *)0x0) &&
       (((xmlAttributePtr)table)->elem != (xmlChar *)0x0)) {
      if (ns != (xmlChar *)0x0) {
        if (p_Stack_60 == (xmlDictPtr)0x0) {
          pxVar3 = xmlStrdup(ns);
          ((xmlAttributePtr)table)->prefix = pxVar3;
        }
        else {
          pxVar3 = xmlDictLookup(p_Stack_60,ns,-1);
          ((xmlAttributePtr)table)->prefix = pxVar3;
        }
        if (((xmlAttributePtr)table)->prefix == (xmlChar *)0x0) goto LAB_00179a8c;
      }
      ((xmlAttributePtr)table)->def = def;
      ((xmlAttributePtr)table)->tree = tree;
      tree = (xmlEnumerationPtr)0x0;
      if (defaultValue != (xmlChar *)0x0) {
        if (p_Stack_60 == (xmlDictPtr)0x0) {
          pxVar3 = xmlStrdup(defaultValue);
          ((xmlAttributePtr)table)->defaultValue = pxVar3;
        }
        else {
          pxVar3 = xmlDictLookup(p_Stack_60,defaultValue,-1);
          ((xmlAttributePtr)table)->defaultValue = pxVar3;
        }
        if (((xmlAttributePtr)table)->defaultValue == (xmlChar *)0x0) goto LAB_00179a8c;
      }
      elem_00 = xmlGetDtdElementDesc2(ctxt,dtd,elem);
      if (elem_00 != (xmlElementPtr)0x0) {
        iVar1 = xmlHashAdd3((xmlHashTablePtr)elemDef,((xmlAttributePtr)table)->name,
                            ((xmlAttributePtr)table)->prefix,((xmlAttributePtr)table)->elem,table);
        if (0 < iVar1) {
          if (((type == XML_ATTRIBUTE_ID) &&
              (iVar1 = xmlScanIDAttributeDecl(ctxt,elem_00,1), iVar1 != 0)) &&
             (xmlErrValidNode(ctxt,(xmlNodePtr)dtd,XML_DTD_MULTIPLE_ID,
                              "Element %s has too may ID attributes defined : %s\n",elem,name,
                              (xmlChar *)0x0), ctxt != (xmlValidCtxtPtr)0x0)) {
            ctxt->valid = 0;
          }
          iVar1 = xmlStrEqual(((xmlAttributePtr)table)->name,"xmlns");
          if ((iVar1 == 0) &&
             ((((xmlAttributePtr)table)->prefix == (xmlChar *)0x0 ||
              (iVar1 = xmlStrEqual(((xmlAttributePtr)table)->prefix,"xmlns"), iVar1 == 0)))) {
            local_70 = elem_00->attributes;
            while( true ) {
              bVar4 = false;
              if (local_70 != (xmlAttributePtr)0x0) {
                iVar1 = xmlStrEqual(local_70->name,"xmlns");
                bVar4 = true;
                if ((iVar1 == 0) &&
                   (bVar4 = false, ((xmlAttributePtr)table)->prefix != (xmlChar *)0x0)) {
                  iVar1 = xmlStrEqual(((xmlAttributePtr)table)->prefix,"xmlns");
                  bVar4 = iVar1 != 0;
                }
              }
              if ((!bVar4) || (local_70->nexth == (_xmlAttribute *)0x0)) break;
              local_70 = local_70->nexth;
            }
            if (local_70 == (xmlAttributePtr)0x0) {
              ((xmlAttributePtr)table)->nexth = elem_00->attributes;
              elem_00->attributes = (xmlAttributePtr)table;
            }
            else {
              ((xmlAttributePtr)table)->nexth = local_70->nexth;
              local_70->nexth = (_xmlAttribute *)table;
            }
          }
          else {
            ((xmlAttributePtr)table)->nexth = elem_00->attributes;
            elem_00->attributes = (xmlAttributePtr)table;
          }
          ((xmlAttributePtr)table)->parent = dtd;
          if (dtd->last == (_xmlNode *)0x0) {
            dtd->last = (_xmlNode *)table;
            dtd->children = (_xmlNode *)table;
            return (xmlAttributePtr)table;
          }
          dtd->last->next = (_xmlNode *)table;
          ((xmlAttributePtr)table)->prev = dtd->last;
          dtd->last = (_xmlNode *)table;
          return (xmlAttributePtr)table;
        }
        if (-1 < iVar1) {
          xmlErrValidWarning(ctxt,(xmlNodePtr)dtd,XML_DTD_ATTRIBUTE_REDEFINED,
                             "Attribute %s of element %s: already defined\n",name,elem,
                             (xmlChar *)0x0);
          xmlFreeAttribute((xmlAttributePtr)table);
          return (xmlAttributePtr)0x0;
        }
      }
    }
  }
LAB_00179a8c:
  xmlVErrMemory(ctxt);
  xmlFreeEnumeration(tree);
  xmlFreeAttribute((xmlAttributePtr)table);
  return (xmlAttributePtr)0x0;
}

Assistant:

xmlAttributePtr
xmlAddAttributeDecl(xmlValidCtxtPtr ctxt,
                    xmlDtdPtr dtd, const xmlChar *elem,
                    const xmlChar *name, const xmlChar *ns,
		    xmlAttributeType type, xmlAttributeDefault def,
		    const xmlChar *defaultValue, xmlEnumerationPtr tree) {
    xmlAttributePtr ret = NULL;
    xmlAttributeTablePtr table;
    xmlElementPtr elemDef;
    xmlDictPtr dict = NULL;
    int res;

    if (dtd == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (name == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (elem == NULL) {
	xmlFreeEnumeration(tree);
	return(NULL);
    }
    if (dtd->doc != NULL)
	dict = dtd->doc->dict;

#ifdef LIBXML_VALID_ENABLED
    /*
     * Check the type and possibly the default value.
     */
    switch (type) {
        case XML_ATTRIBUTE_CDATA:
	    break;
        case XML_ATTRIBUTE_ID:
	    break;
        case XML_ATTRIBUTE_IDREF:
	    break;
        case XML_ATTRIBUTE_IDREFS:
	    break;
        case XML_ATTRIBUTE_ENTITY:
	    break;
        case XML_ATTRIBUTE_ENTITIES:
	    break;
        case XML_ATTRIBUTE_NMTOKEN:
	    break;
        case XML_ATTRIBUTE_NMTOKENS:
	    break;
        case XML_ATTRIBUTE_ENUMERATION:
	    break;
        case XML_ATTRIBUTE_NOTATION:
	    break;
	default:
	    xmlErrValid(ctxt, XML_ERR_ARGUMENT,
		    "xmlAddAttributeDecl: invalid type\n", NULL);
	    xmlFreeEnumeration(tree);
	    return(NULL);
    }
    if ((defaultValue != NULL) &&
        (!xmlValidateAttributeValueInternal(dtd->doc, type, defaultValue))) {
	xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_ATTRIBUTE_DEFAULT,
	                "Attribute %s of %s: invalid default value\n",
	                elem, name, defaultValue);
	defaultValue = NULL;
	if (ctxt != NULL)
	    ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check first that an attribute defined in the external subset wasn't
     * already defined in the internal subset
     */
    if ((dtd->doc != NULL) && (dtd->doc->extSubset == dtd) &&
	(dtd->doc->intSubset != NULL) &&
	(dtd->doc->intSubset->attributes != NULL)) {
        ret = xmlHashLookup3(dtd->doc->intSubset->attributes, name, ns, elem);
	if (ret != NULL) {
	    xmlFreeEnumeration(tree);
	    return(NULL);
	}
    }

    /*
     * Create the Attribute table if needed.
     */
    table = (xmlAttributeTablePtr) dtd->attributes;
    if (table == NULL) {
        table = xmlHashCreateDict(0, dict);
	dtd->attributes = (void *) table;
    }
    if (table == NULL)
        goto mem_error;

    ret = (xmlAttributePtr) xmlMalloc(sizeof(xmlAttribute));
    if (ret == NULL)
        goto mem_error;
    memset(ret, 0, sizeof(xmlAttribute));
    ret->type = XML_ATTRIBUTE_DECL;

    /*
     * fill the structure.
     */
    ret->atype = type;
    /*
     * doc must be set before possible error causes call
     * to xmlFreeAttribute (because it's used to check on
     * dict use)
     */
    ret->doc = dtd->doc;
    if (dict) {
	ret->name = xmlDictLookup(dict, name, -1);
	ret->elem = xmlDictLookup(dict, elem, -1);
    } else {
	ret->name = xmlStrdup(name);
	ret->elem = xmlStrdup(elem);
    }
    if ((ret->name == NULL) || (ret->elem == NULL))
        goto mem_error;
    if (ns != NULL) {
        if (dict)
            ret->prefix = xmlDictLookup(dict, ns, -1);
        else
            ret->prefix = xmlStrdup(ns);
        if (ret->prefix == NULL)
            goto mem_error;
    }
    ret->def = def;
    ret->tree = tree;
    tree = NULL;
    if (defaultValue != NULL) {
        if (dict)
	    ret->defaultValue = xmlDictLookup(dict, defaultValue, -1);
	else
	    ret->defaultValue = xmlStrdup(defaultValue);
        if (ret->defaultValue == NULL)
            goto mem_error;
    }

    elemDef = xmlGetDtdElementDesc2(ctxt, dtd, elem);
    if (elemDef == NULL)
        goto mem_error;

    /*
     * Validity Check:
     * Search the DTD for previous declarations of the ATTLIST
     */
    res = xmlHashAdd3(table, ret->name, ret->prefix, ret->elem, ret);
    if (res <= 0) {
        if (res < 0)
            goto mem_error;
#ifdef LIBXML_VALID_ENABLED
        /*
         * The attribute is already defined in this DTD.
         */
        xmlErrValidWarning(ctxt, (xmlNodePtr) dtd,
                XML_DTD_ATTRIBUTE_REDEFINED,
                "Attribute %s of element %s: already defined\n",
                name, elem, NULL);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeAttribute(ret);
	return(NULL);
    }

    /*
     * Validity Check:
     * Multiple ID per element
     */
#ifdef LIBXML_VALID_ENABLED
    if ((type == XML_ATTRIBUTE_ID) &&
        (xmlScanIDAttributeDecl(ctxt, elemDef, 1) != 0)) {
        xmlErrValidNode(ctxt, (xmlNodePtr) dtd, XML_DTD_MULTIPLE_ID,
       "Element %s has too may ID attributes defined : %s\n",
               elem, name, NULL);
        if (ctxt != NULL)
            ctxt->valid = 0;
    }
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Insert namespace default def first they need to be
     * processed first.
     */
    if ((xmlStrEqual(ret->name, BAD_CAST "xmlns")) ||
        ((ret->prefix != NULL &&
         (xmlStrEqual(ret->prefix, BAD_CAST "xmlns"))))) {
        ret->nexth = elemDef->attributes;
        elemDef->attributes = ret;
    } else {
        xmlAttributePtr tmp = elemDef->attributes;

        while ((tmp != NULL) &&
               ((xmlStrEqual(tmp->name, BAD_CAST "xmlns")) ||
                ((ret->prefix != NULL &&
                 (xmlStrEqual(ret->prefix, BAD_CAST "xmlns")))))) {
            if (tmp->nexth == NULL)
                break;
            tmp = tmp->nexth;
        }
        if (tmp != NULL) {
            ret->nexth = tmp->nexth;
            tmp->nexth = ret;
        } else {
            ret->nexth = elemDef->attributes;
            elemDef->attributes = ret;
        }
    }

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
        dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFreeEnumeration(tree);
    xmlFreeAttribute(ret);
    return(NULL);
}